

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Padding_x86_avx2::forward_int8
          (Padding_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined8 *in_RCX;
  long in_RSI;
  Allocator *in_RDI;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat m_1;
  Mat borderm_1;
  int z;
  int64_t pad_value_3;
  int64_t v8_3;
  int q_1;
  int outd;
  int outh_2;
  int outw_3;
  Mat m;
  int64_t pad_value_2;
  int64_t v8_2;
  Mat borderm;
  int q;
  int front_;
  size_t out_elemsize_2;
  int out_elempack_2;
  int outc;
  int outh_1;
  int outw_2;
  int64_t pad_value_1;
  int64_t v8_1;
  size_t out_elemsize_1;
  int out_elempack_1;
  int outh;
  int outw_1;
  int64_t pad_value;
  int64_t v8;
  size_t out_elemsize;
  int out_elempack;
  int outw;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_fffffffffffffc88;
  Mat *in_stack_fffffffffffffc90;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  int in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca4;
  long in_stack_fffffffffffffca8;
  int _w;
  undefined1 *_v;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  int in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  Mat *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  int64_t in_stack_fffffffffffffce0;
  Mat *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  undefined1 local_220 [148];
  int local_18c;
  ulong local_188;
  ulong local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  ulong local_110;
  ulong local_108;
  int local_b8;
  int local_b4;
  Option *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Padding *in_stack_ffffffffffffff68;
  
  iVar9 = *(int *)(in_RSI + 0x2c);
  iVar1 = *(int *)(in_RSI + 0x30);
  iVar2 = *(int *)(in_RSI + 0x34);
  iVar3 = *(int *)(in_RSI + 0x38);
  iVar4 = *(int *)(in_RSI + 0x28);
  iVar5 = *(int *)(in_RSI + 0x18);
  if (iVar5 == 8) {
    _w = (int)((ulong)in_stack_fffffffffffffca8 >> 0x20);
    if (iVar4 == 1) {
      iVar7 = 1;
      if ((iVar9 * 8 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1b]._vptr_Allocator) +
          *(int *)((undefined1 *)((long)&in_RDI[0x1b]._vptr_Allocator + 4) +
                  (long)in_RDI->_vptr_Allocator[-3])) % 8 == 0) {
        iVar7 = 8;
      }
      if (((*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1b]._vptr_Allocator) % 8 == 0) &&
          (iVar7 == 8)) &&
         (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 0)) {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),_w,
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc9c,(Allocator *)in_stack_fffffffffffffc90);
        bVar6 = ncnn::Mat::empty(in_stack_fffffffffffffc90);
        if (!bVar6) {
          padding_constant_pack8_int8_sse
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffcbc,
                     in_stack_fffffffffffffcb8,in_stack_fffffffffffffce0);
          return 0;
        }
        return -100;
      }
    }
    iVar7 = (int)in_stack_fffffffffffffca8;
    if (iVar4 == 2) {
      iVar8 = 1;
      if ((iVar1 * 8 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) +
          *(int *)((undefined1 *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) +
                  (long)in_RDI->_vptr_Allocator[-3])) % 8 == 0) {
        iVar8 = 8;
      }
      if (((*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) % 8 == 0) &&
          (iVar8 == 8)) &&
         (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 0)) {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),_w,
                          iVar7,CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc9c,(Allocator *)in_stack_fffffffffffffc90);
        bVar6 = ncnn::Mat::empty(in_stack_fffffffffffffc90);
        if (!bVar6) {
          padding_constant_pack8_int8_sse
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) / 8
                     ,in_stack_fffffffffffffcb8,in_stack_fffffffffffffce0);
          return 0;
        }
        return -100;
      }
    }
    if (iVar4 == 3) {
      in_stack_ffffffffffffff64 =
           iVar9 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1b]._vptr_Allocator) +
           *(int *)((undefined1 *)((long)&in_RDI[0x1b]._vptr_Allocator + 4) +
                   (long)in_RDI->_vptr_Allocator[-3]);
      in_stack_ffffffffffffff60 =
           iVar1 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator) +
           *(int *)((undefined1 *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) +
                   (long)in_RDI->_vptr_Allocator[-3]);
      in_stack_ffffffffffffff5c =
           iVar3 * 8 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1d]._vptr_Allocator) +
           *(int *)((undefined1 *)((long)&in_RDI[0x1d]._vptr_Allocator + 4) +
                   (long)in_RDI->_vptr_Allocator[-3]);
      in_stack_ffffffffffffff58 = 1;
      if (in_stack_ffffffffffffff5c % 8 == 0) {
        in_stack_ffffffffffffff58 = 8;
      }
      in_stack_ffffffffffffff50 =
           (Option *)((*(ulong *)(in_RSI + 0x10) / 8) * (long)in_stack_ffffffffffffff58);
      if (((*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1d]._vptr_Allocator) % 8 == 0) &&
          (in_stack_ffffffffffffff58 == 8)) &&
         ((in_stack_ffffffffffffff5c == iVar3 * 8 ||
          (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 0)))) {
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),_w,
                          iVar7,in_stack_fffffffffffffca4,
                          CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                          (int)((ulong)in_stack_fffffffffffffc90 >> 0x20),in_RDI);
        bVar6 = ncnn::Mat::empty(in_stack_fffffffffffffc90);
        if (!bVar6) {
          local_b4 = *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1d]._vptr_Allocator) / 8
          ;
          for (local_b8 = 0; local_b8 < in_stack_ffffffffffffff5c / in_stack_ffffffffffffff58;
              local_b8 = local_b8 + 1) {
            iVar9 = local_b8;
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_ffffffffffffff60),
                               local_b8);
            local_108 = (ulong)*(float *)((undefined1 *)((long)&in_RDI[0x1c]._vptr_Allocator + 4) +
                                         (long)in_RDI->_vptr_Allocator[-3]);
            local_110 = local_108 | local_108 << 8 | local_108 << 0x10 | local_108 << 0x18 |
                        local_108 << 0x20 | local_108 << 0x28 | local_108 << 0x30 |
                        local_108 << 0x38;
            if ((local_b8 - local_b4 < 0) || (iVar3 <= local_b8 - local_b4)) {
              ncnn::Mat::fill<long>
                        ((Mat *)CONCAT44(iVar9,in_stack_fffffffffffffcb0),in_stack_fffffffffffffca8)
              ;
            }
            else {
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_ffffffffffffff60
                                                ),iVar9);
              if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 0)
              {
                padding_constant_pack8_int8_sse
                          (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffcbc,
                           in_stack_ffffffffffffff60,in_stack_fffffffffffffce0);
              }
              if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 1)
              {
                padding_replicate_pack8_int8_sse
                          (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                           (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                           (int)in_stack_fffffffffffffce0,
                           (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                           (int)in_stack_fffffffffffffcd8);
              }
              if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 2)
              {
                padding_reflect_pack8_int8_sse
                          (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                           (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                           (int)in_stack_fffffffffffffce0,
                           (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
                           (int)in_stack_fffffffffffffcd8);
              }
              ncnn::Mat::~Mat((Mat *)0x69d833);
            }
            ncnn::Mat::~Mat((Mat *)0x69d840);
          }
          return 0;
        }
        return -100;
      }
    }
    if (iVar4 == 4) {
      local_16c = iVar9 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1b]._vptr_Allocator
                                  ) +
                  *(int *)((undefined1 *)((long)&in_RDI[0x1b]._vptr_Allocator + 4) +
                          (long)in_RDI->_vptr_Allocator[-3]);
      local_170 = iVar1 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1a]._vptr_Allocator
                                  ) +
                  *(int *)((undefined1 *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) +
                          (long)in_RDI->_vptr_Allocator[-3]);
      local_174 = iVar2 + *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1d]._vptr_Allocator
                                  ) +
                  *(int *)((undefined1 *)((long)&in_RDI[0x1d]._vptr_Allocator + 4) +
                          (long)in_RDI->_vptr_Allocator[-3]);
      if (*(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1c]._vptr_Allocator) == 0) {
        this_00 = (Mat *)in_RCX[1];
        ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),_w,
                          iVar7,in_stack_fffffffffffffca4,in_stack_fffffffffffffca0,
                          CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),(int)in_RDI,
                          (Allocator *)in_stack_fffffffffffffcc8);
        bVar6 = ncnn::Mat::empty(this_00);
        if (!bVar6) {
          for (local_178 = 0; local_178 < iVar3; local_178 = local_178 + 1) {
            local_180 = (ulong)*(float *)((undefined1 *)((long)&in_RDI[0x1c]._vptr_Allocator + 4) +
                                         (long)in_RDI->_vptr_Allocator[-3]);
            local_188 = local_180 | local_180 << 8 | local_180 << 0x10 | local_180 << 0x18 |
                        local_180 << 0x20 | local_180 << 0x28 | local_180 << 0x30 |
                        local_180 << 0x38;
            for (local_18c = 0; local_18c < local_174; local_18c = local_18c + 1) {
              _v = local_220;
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8
                                                ),in_stack_fffffffffffffcb4);
              ncnn::Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
                               (int)((ulong)this_00 >> 0x20));
              ncnn::Mat::~Mat((Mat *)0x69dab0);
              if ((local_18c -
                   *(int *)(in_RDI->_vptr_Allocator[-3] + (long)&in_RDI[0x1d]._vptr_Allocator) < 0)
                 || (iVar2 <= local_18c -
                              *(int *)(in_RDI->_vptr_Allocator[-3] +
                                      (long)&in_RDI[0x1d]._vptr_Allocator))) {
                ncnn::Mat::fill<long>
                          ((Mat *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                           (long)_v);
              }
              else {
                ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffcbc,
                                                   in_stack_fffffffffffffcb8),
                                   in_stack_fffffffffffffcb4);
                ncnn::Mat::depth((Mat *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98
                                                ),(int)((ulong)this_00 >> 0x20));
                ncnn::Mat::~Mat((Mat *)0x69dbab);
                padding_constant_pack8_int8_sse
                          (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                           (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffcbc,
                           in_stack_fffffffffffffcb8,in_stack_fffffffffffffce0);
                ncnn::Mat::~Mat((Mat *)0x69dc07);
              }
              ncnn::Mat::~Mat((Mat *)0x69dc5c);
            }
          }
          return 0;
        }
        return -100;
      }
    }
  }
  ncnn::Mat::Mat(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  if (iVar5 != 1) {
    convert_packing((Mat *)in_RCX[2],(Mat *)*in_RCX,(int)((ulong)in_RDI >> 0x20),
                    (Option *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  }
  iVar9 = Padding::forward(in_stack_ffffffffffffff68,
                           (Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           (Mat *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff50);
  ncnn::Mat::~Mat((Mat *)0x69dd90);
  return iVar9;
}

Assistant:

int Padding_x86_avx2::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}